

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

char * luaL_findtable(lua_State *L,int idx,char *fname,int szhint)

{
  StkId pTVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  int nrec;
  
  lua_pushvalue(L,idx);
  do {
    pcVar3 = strchr(fname,0x2e);
    if (pcVar3 == (char *)0x0) {
      sVar4 = strlen(fname);
      pcVar3 = fname + sVar4;
    }
    lua_pushlstring(L,fname,(long)pcVar3 - (long)fname);
    lua_rawget(L,-2);
    iVar2 = lua_type(L,-1);
    if (iVar2 == 0) {
      L->top = L->top + -1;
      iVar2 = 1;
      if (*pcVar3 != '.') {
        iVar2 = szhint;
      }
      lua_createtable(L,iVar2,nrec);
      lua_pushlstring(L,fname,(long)pcVar3 - (long)fname);
      lua_pushvalue(L,-2);
      pTVar1 = L->top;
      luaV_settable(L,pTVar1 + -4,pTVar1 + -2,pTVar1 + -1);
      L->top = L->top + -2;
    }
    else {
      iVar2 = lua_type(L,-1);
      if (iVar2 != 5) {
        L->top = L->top + -2;
        return fname;
      }
    }
    lua_remove(L,-2);
    fname = pcVar3 + 1;
  } while (*pcVar3 == '.');
  return (char *)0x0;
}

Assistant:

static const char*luaL_findtable(lua_State*L,int idx,
const char*fname,int szhint){
const char*e;
lua_pushvalue(L,idx);
do{
e=strchr(fname,'.');
if(e==NULL)e=fname+strlen(fname);
lua_pushlstring(L,fname,e-fname);
lua_rawget(L,-2);
if(lua_isnil(L,-1)){
lua_pop(L,1);
lua_createtable(L,0,(*e=='.'?1:szhint));
lua_pushlstring(L,fname,e-fname);
lua_pushvalue(L,-2);
lua_settable(L,-4);
}
else if(!lua_istable(L,-1)){
lua_pop(L,2);
return fname;
}
lua_remove(L,-2);
fname=e+1;
}while(*e=='.');
return NULL;
}